

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

string * __thiscall
testing::internal::FormatFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  size_type *psVar1;
  long lVar2;
  size_t sVar3;
  undefined8 *puVar4;
  long *plVar5;
  size_type *psVar6;
  pointer pcVar7;
  undefined8 uVar8;
  size_type *local_b0;
  string file_name;
  long local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  long *local_70;
  undefined8 local_68;
  long local_60;
  undefined8 uStack_58;
  size_type *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  int line_local;
  
  __str.field_2._12_4_ = SUB84(file,0);
  if (this == (internal *)0x0) {
    this = (internal *)"unknown file";
  }
  local_b0 = &file_name._M_string_length;
  sVar3 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,this,this + sVar3);
  if ((int)__str.field_2._12_4_ < 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_b0,file_name._M_dataplus._M_p + (long)local_b0
              );
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    goto LAB_00147b62;
  }
  psVar1 = &__str._M_string_length;
  local_50 = psVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_b0,file_name._M_dataplus._M_p + (long)local_b0);
  std::__cxx11::string::append((char *)&local_50);
  StreamableToString<int>
            ((string *)((long)&file_name.field_2 + 8),(int *)(__str.field_2._M_local_buf + 0xc));
  pcVar7 = (pointer)0xf;
  if (local_50 != psVar1) {
    pcVar7 = (pointer)__str._M_string_length;
  }
  if (pcVar7 < __str._M_dataplus._M_p + local_88) {
    uVar8 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)file_name.field_2._8_8_ != &local_80) {
      uVar8 = local_80._M_allocated_capacity;
    }
    if ((ulong)uVar8 < __str._M_dataplus._M_p + local_88) goto LAB_00147a33;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)((long)&file_name.field_2 + 8),0,(char *)0x0,(ulong)local_50);
  }
  else {
LAB_00147a33:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_50,file_name.field_2._8_8_);
  }
  local_70 = &local_60;
  plVar5 = puVar4 + 2;
  if ((long *)*puVar4 == plVar5) {
    local_60 = *plVar5;
    uStack_58 = puVar4[3];
  }
  else {
    local_60 = *plVar5;
    local_70 = (long *)*puVar4;
  }
  local_68 = puVar4[1];
  *puVar4 = plVar5;
  puVar4[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar6) {
    lVar2 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)file_name.field_2._8_8_ != &local_80) {
    operator_delete((void *)file_name.field_2._8_8_,(ulong)(local_80._M_allocated_capacity + 1));
  }
  if (local_50 != psVar1) {
    operator_delete(local_50,__str._M_string_length + 1);
  }
LAB_00147b62:
  if (local_b0 != &file_name._M_string_length) {
    operator_delete(local_b0,file_name._M_string_length + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ::std::string FormatFileLocation(const char* file, int line) {
  const std::string file_name(file == NULL ? kUnknownFile : file);

  if (line < 0) {
    return file_name + ":";
  }
#ifdef _MSC_VER
  return file_name + "(" + StreamableToString(line) + "):";
#else
  return file_name + ":" + StreamableToString(line) + ":";
#endif  // _MSC_VER
}